

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtIthVar(word *pOut,int iVar,int nVars)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar1 = (char)nVars - 6U & 0x1f;
  uVar2 = 0;
  if (0 < 1 << bVar1) {
    uVar2 = 1 << bVar1;
  }
  uVar3 = (ulong)uVar2;
  if (nVars < 7) {
    uVar3 = 1;
  }
  if (iVar < 6) {
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pOut[uVar4] = s_Truths6[iVar];
    }
  }
  else {
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pOut[uVar4] = -(ulong)((1 << ((char)iVar - 6U & 0x1f) & (uint)uVar4) != 0);
    }
  }
  return;
}

Assistant:

static inline void Abc_TtIthVar( word * pOut, int iVar, int nVars )
{
    int k, nWords = Abc_TtWordNum( nVars );
    if ( iVar < 6 )
    {
        for ( k = 0; k < nWords; k++ )
            pOut[k] = s_Truths6[iVar];
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( k & (1 << (iVar-6)) )
                pOut[k] = ~(word)0;
            else
                pOut[k] = 0;
    }
}